

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O1

StringRef __thiscall
llvm::sys::detail::getHostCPUNameForPowerPC(detail *this,StringRef ProcCpuinfoContent)

{
  detail dVar1;
  long lVar2;
  size_t sVar3;
  char *__s;
  detail *pdVar4;
  char *pcVar5;
  detail *pdVar6;
  detail *pdVar7;
  bool bVar8;
  bool bVar9;
  StringRef SVar10;
  
  if ((long)ProcCpuinfoContent.Data < 1) {
    bVar8 = true;
    pdVar7 = (detail *)0x0;
    lVar2 = 0;
LAB_00174ddc:
    if (bVar8) {
      sVar3 = 7;
      __s = "generic";
    }
    else {
      if (lVar2 == 4) {
        bVar8 = *(int *)pdVar7 == 0x65343036;
      }
      else {
        bVar8 = false;
      }
      if (bVar8) {
        pcVar5 = "604e";
      }
      else {
        if (lVar2 == 3) {
          bVar9 = pdVar7[2] == (detail)0x34 && *(short *)pdVar7 == 0x3036;
        }
        else {
          bVar9 = false;
        }
        pcVar5 = "604e";
        if (bVar9) {
          pcVar5 = "604";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 4) {
          bVar9 = *(int *)pdVar7 == 0x30303437;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "7400";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 4) {
          bVar9 = *(int *)pdVar7 == 0x30313437;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "7400";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 4) {
          bVar9 = *(int *)pdVar7 == 0x37343437;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "7400";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 4) {
          bVar9 = *(int *)pdVar7 == 0x35353437;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "7450";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 2) {
          bVar9 = *(short *)pdVar7 == 0x3447;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "g4";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 6) {
          bVar9 = *(short *)(pdVar7 + 4) == 0x3452 && *(int *)pdVar7 == 0x45574f50;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "970";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 8) {
          bVar9 = *(long *)pdVar7 == 0x5846303739435050;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "970";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 8) {
          bVar9 = *(long *)pdVar7 == 0x504d303739435050;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "970";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 2) {
          bVar9 = *(short *)pdVar7 == 0x3547;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "g5";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 6) {
          bVar9 = *(short *)(pdVar7 + 4) == 0x3552 && *(int *)pdVar7 == 0x45574f50;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "g5";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 2) {
          bVar9 = *(short *)pdVar7 == 0x3241;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "a2";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 6) {
          bVar9 = *(short *)(pdVar7 + 4) == 0x3652 && *(int *)pdVar7 == 0x45574f50;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "pwr6";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 6) {
          bVar9 = *(short *)(pdVar7 + 4) == 0x3752 && *(int *)pdVar7 == 0x45574f50;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "pwr7";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 6) {
          bVar9 = *(short *)(pdVar7 + 4) == 0x3852 && *(int *)pdVar7 == 0x45574f50;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "pwr8";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 7) {
          bVar9 = *(int *)(pdVar7 + 3) == 0x45385245 && *(int *)pdVar7 == 0x45574f50;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "pwr8";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 9) {
          bVar9 = pdVar7[8] == (detail)0x4c && *(long *)pdVar7 == 0x564e385245574f50;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "pwr8";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      if (!bVar8) {
        if (lVar2 == 6) {
          bVar9 = *(short *)(pdVar7 + 4) == 0x3952 && *(int *)pdVar7 == 0x45574f50;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          pcVar5 = "pwr9";
        }
        bVar8 = true;
        if (!bVar9) {
          bVar8 = false;
        }
      }
      __s = "generic";
      if (bVar8) {
        __s = pcVar5;
      }
      if (__s == (char *)0x0) {
        sVar3 = 0;
      }
      else {
        sVar3 = strlen(__s);
      }
    }
    SVar10.Length = sVar3;
    SVar10.Data = __s;
    return SVar10;
  }
  pdVar4 = (detail *)(ProcCpuinfoContent.Data + (long)this);
  lVar2 = 0;
LAB_00174cdf:
  pdVar6 = this + (*this == (detail)0xa);
  pdVar7 = pdVar6;
  if (((((pdVar6 < pdVar4) && (*pdVar6 == (detail)0x63)) && (pdVar7 = pdVar6 + 1, pdVar7 < pdVar4))
      && ((*pdVar7 == (detail)0x70 && (pdVar7 = pdVar6 + 2, pdVar7 < pdVar4)))) &&
     ((*pdVar7 == (detail)0x75 && (pdVar7 = pdVar6 + 3, pdVar7 < pdVar4)))) {
    pdVar6 = this + (ulong)(*this == (detail)0xa) + 4;
    do {
      dVar1 = *pdVar7;
      if ((dVar1 != (detail)0x9) && (dVar1 != (detail)0x20)) {
        if ((dVar1 == (detail)0x3a) && (pdVar7 = pdVar7 + 1, pdVar7 < pdVar4)) goto LAB_00174d8a;
        break;
      }
      pdVar7 = pdVar7 + 1;
      pdVar6 = pdVar6 + 1;
    } while (pdVar7 < pdVar4);
  }
  goto LAB_00174d42;
  while( true ) {
    pdVar7 = pdVar7 + 1;
    pdVar6 = pdVar6 + 1;
    if (pdVar4 <= pdVar7) break;
LAB_00174d8a:
    if ((*pdVar7 != (detail)0x9) && (this = pdVar7, *pdVar7 != (detail)0x20))
    goto joined_r0x00174db0;
  }
LAB_00174d42:
  this = pdVar7;
  pdVar7 = (detail *)0x0;
LAB_00174d44:
  if (pdVar7 == (detail *)0x0) {
    for (; (this < pdVar4 && (*this != (detail)0xa)); this = this + 1) {
    }
  }
  bVar8 = pdVar7 == (detail *)0x0;
  if ((pdVar4 <= this) || (pdVar7 != (detail *)0x0)) goto LAB_00174ddc;
  goto LAB_00174cdf;
joined_r0x00174db0:
  while ((this < pdVar4 &&
         ((0x2c < (ulong)(byte)*this || ((0x100100000600U >> ((ulong)(byte)*this & 0x3f) & 1) == 0))
         ))) {
    this = this + 1;
  }
  lVar2 = (long)this - (long)pdVar6;
  goto LAB_00174d44;
}

Assistant:

StringRef sys::detail::getHostCPUNameForPowerPC(StringRef ProcCpuinfoContent) {
  // Access to the Processor Version Register (PVR) on PowerPC is privileged,
  // and so we must use an operating-system interface to determine the current
  // processor type. On Linux, this is exposed through the /proc/cpuinfo file.
  const char *generic = "generic";

  // The cpu line is second (after the 'processor: 0' line), so if this
  // buffer is too small then something has changed (or is wrong).
  StringRef::const_iterator CPUInfoStart = ProcCpuinfoContent.begin();
  StringRef::const_iterator CPUInfoEnd = ProcCpuinfoContent.end();

  StringRef::const_iterator CIP = CPUInfoStart;

  StringRef::const_iterator CPUStart = 0;
  size_t CPULen = 0;

  // We need to find the first line which starts with cpu, spaces, and a colon.
  // After the colon, there may be some additional spaces and then the cpu type.
  while (CIP < CPUInfoEnd && CPUStart == 0) {
    if (CIP < CPUInfoEnd && *CIP == '\n')
      ++CIP;

    if (CIP < CPUInfoEnd && *CIP == 'c') {
      ++CIP;
      if (CIP < CPUInfoEnd && *CIP == 'p') {
        ++CIP;
        if (CIP < CPUInfoEnd && *CIP == 'u') {
          ++CIP;
          while (CIP < CPUInfoEnd && (*CIP == ' ' || *CIP == '\t'))
            ++CIP;

          if (CIP < CPUInfoEnd && *CIP == ':') {
            ++CIP;
            while (CIP < CPUInfoEnd && (*CIP == ' ' || *CIP == '\t'))
              ++CIP;

            if (CIP < CPUInfoEnd) {
              CPUStart = CIP;
              while (CIP < CPUInfoEnd && (*CIP != ' ' && *CIP != '\t' &&
                                          *CIP != ',' && *CIP != '\n'))
                ++CIP;
              CPULen = CIP - CPUStart;
            }
          }
        }
      }
    }

    if (CPUStart == 0)
      while (CIP < CPUInfoEnd && *CIP != '\n')
        ++CIP;
  }

  if (CPUStart == 0)
    return generic;

  return StringSwitch<const char *>(StringRef(CPUStart, CPULen))
      .Case("604e", "604e")
      .Case("604", "604")
      .Case("7400", "7400")
      .Case("7410", "7400")
      .Case("7447", "7400")
      .Case("7455", "7450")
      .Case("G4", "g4")
      .Case("POWER4", "970")
      .Case("PPC970FX", "970")
      .Case("PPC970MP", "970")
      .Case("G5", "g5")
      .Case("POWER5", "g5")
      .Case("A2", "a2")
      .Case("POWER6", "pwr6")
      .Case("POWER7", "pwr7")
      .Case("POWER8", "pwr8")
      .Case("POWER8E", "pwr8")
      .Case("POWER8NVL", "pwr8")
      .Case("POWER9", "pwr9")
      .Default(generic);
}